

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Node<QObject_*,_QString>::emplaceValue<QString>
          (Node<QObject_*,_QString> *this,QString *args)

{
  qsizetype qVar1;
  QArrayData *data;
  Data *pDVar2;
  char16_t *pcVar3;
  
  qVar1 = (args->d).size;
  (args->d).size = 0;
  pDVar2 = (args->d).d;
  pcVar3 = (args->d).ptr;
  (args->d).d = (Data *)0x0;
  (args->d).ptr = (char16_t *)0x0;
  data = &((this->value).d.d)->super_QArrayData;
  (this->value).d.d = pDVar2;
  (this->value).d.ptr = pcVar3;
  (this->value).d.size = qVar1;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }